

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_effectiveness.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  type_conflict2 tVar2;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  string *file_name_00;
  directory_iterator i;
  directory_iterator end_itr;
  regex input_file_filter;
  smatch what;
  path p;
  string file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_dir;
  vector<unsigned_int,_std::allocator<unsigned_int>_> input_u32s;
  string short_name;
  variables_map cmdargs;
  directory_iterator local_448;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_440;
  shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
  local_438;
  undefined1 local_428 [32];
  undefined1 uStack_408;
  undefined8 uStack_407;
  undefined8 uStack_3ff;
  shared_ptr<boost::re_detail_107400::named_subexpressions> local_3f0;
  int local_3e0;
  bool local_3dc;
  path local_3d0;
  int local_3b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388 [32];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  allocator<char> local_150 [32];
  key_type local_130;
  string local_110;
  string local_f0;
  string local_d0 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [144];
  
  parse_cmdargs((int)local_d0,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_428,"input",(allocator<char> *)&local_3d0);
  operand = (any *)boost::program_options::abstract_variables_map::operator[](local_d0);
  pbVar3 = boost::any_cast<std::__cxx11::string_const&>(operand);
  std::__cxx11::string::string(local_388,(string *)pbVar3);
  std::__cxx11::string::~string((string *)local_428);
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             &local_438,".*\\.u32",0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_428,"text",(allocator<char> *)&local_3d0);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_c0,(key_type *)local_428);
  std::__cxx11::string::~string((string *)local_428);
  if (sVar4 != 0) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                local_428,".*\\.txt",0);
    boost::
    shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
    ::operator=(&local_438,
                (shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
                 *)local_428);
    boost::detail::shared_count::~shared_count((shared_count *)(local_428 + 8));
  }
  std::__cxx11::string::string((string *)&local_3d0,local_388);
  bVar1 = boost::filesystem::is_regular_file(&local_3d0);
  if (bVar1) {
    boost::filesystem::path::filename();
    boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)
               &local_3a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,0);
    boost::
    shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
    ::operator=(&local_438,
                (shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
                 *)&local_3a8);
    boost::detail::shared_count::~shared_count((shared_count *)&local_3a8._M_string_length);
    std::__cxx11::string::~string((string *)local_428);
    boost::filesystem::path::parent_path();
    std::__cxx11::string::_M_assign(local_388);
    std::__cxx11::string::~string((string *)local_428);
  }
  local_440.px = (dir_itr_imp *)0x0;
  std::__cxx11::string::string((string *)local_428,local_388);
  boost::filesystem::directory_iterator::directory_iterator(&local_448,(path *)local_428,none);
  std::__cxx11::string::~string((string *)local_428);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_448,
                       (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_440);
    if (!tVar2) break;
    boost::filesystem::directory_entry::status((directory_entry *)local_3b0);
    if (local_3b0[0] == 2) {
      uStack_408 = 0;
      uStack_407 = 0;
      uStack_3ff = 0;
      local_428._0_8_ = (pointer)0x0;
      local_428._8_8_ = (sp_counted_base *)0x0;
      local_428[0x10] = '\0';
      local_428._17_7_ = 0;
      local_428[0x18] = '\0';
      local_428._25_7_ = 0;
      local_3e0 = 0;
      local_3f0 = (shared_ptr<boost::re_detail_107400::named_subexpressions>)(ZEXT416(0) << 0x40);
      local_3dc = true;
      boost::filesystem::path::filename();
      bVar1 = boost::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        (&local_3a8,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_428,
                         (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)&local_438,format_default);
      std::__cxx11::string::~string((string *)&local_3a8);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_3a8,(string *)((long)local_448.m_imp.px + 8));
        local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"text",local_150);
        sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_c0,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        if (sVar4 == 0) {
          file_name_00 = &local_110;
          std::__cxx11::string::string((string *)file_name_00,(string *)&local_3a8);
          read_file_u32((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130,
                        file_name_00);
        }
        else {
          file_name_00 = &local_f0;
          std::__cxx11::string::string((string *)file_name_00,(string *)&local_3a8);
          read_file_text((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130,
                         file_name_00);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,&local_130);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
        std::__cxx11::string::~string((string *)file_name_00);
        boost::filesystem::path::stem();
        std::__cxx11::string::string((string *)&local_130,(string *)local_150);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::string((string *)&local_170,(string *)&local_130);
        run<ANSfold<1u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::string((string *)&local_190,(string *)&local_130);
        run<ANSfold<2u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::string((string *)&local_1b0,(string *)&local_130);
        run<ANSfold<3u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&local_130);
        run<ANSfold<4u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&local_130);
        run<ANSfold<5u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::string((string *)&local_210,(string *)&local_130);
        run<ANSfold<6u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::string((string *)&local_230,(string *)&local_130);
        run<ANSfold<7u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::string((string *)&local_250,(string *)&local_130);
        run<ANSfold<8u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                         &local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::string((string *)&local_270,(string *)&local_130);
        run<ANSrfold<1u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::string((string *)&local_290,(string *)&local_130);
        run<ANSrfold<2u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::string((string *)&local_2b0,(string *)&local_130);
        run<ANSrfold<3u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::string((string *)&local_2d0,(string *)&local_130);
        run<ANSrfold<4u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::string((string *)&local_2f0,(string *)&local_130);
        run<ANSrfold<5u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::string((string *)&local_310,(string *)&local_130);
        run<ANSrfold<6u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::string((string *)&local_330,(string *)&local_130);
        run<ANSrfold<7u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::string((string *)&local_350,(string *)&local_130);
        run<ANSrfold<8u>>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                          &local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_130);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_368);
        std::__cxx11::string::~string((string *)&local_3a8);
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_428);
    }
    boost::filesystem::directory_iterator::increment(&local_448);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_448.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_440);
  std::__cxx11::string::~string((string *)&local_3d0);
  boost::detail::shared_count::~shared_count(&local_438.pn);
  std::__cxx11::string::~string(local_388);
  boost::program_options::variables_map::~variables_map((variables_map *)local_d0);
  return 0;
}

Assistant:

int main(int argc, char const* argv[])
{
    auto cmdargs = parse_cmdargs(argc, argv);
    auto input_dir = cmdargs["input"].as<std::string>();

    boost::regex input_file_filter(".*\\.u32");
    if (cmdargs.count("text")) {
        input_file_filter = boost::regex(".*\\.txt");
    }

    // single file also works!
    boost::filesystem::path p(input_dir);
    if (boost::filesystem::is_regular_file(p)) {
        input_file_filter = boost::regex(p.filename().string());
        input_dir = p.parent_path().string();
    }

    boost::filesystem::directory_iterator
        end_itr; // Default ctor yields past-the-end
    for (boost::filesystem::directory_iterator i(input_dir); i != end_itr;
         ++i) {
        if (!boost::filesystem::is_regular_file(i->status()))
            continue;
        boost::smatch what;
        if (!boost::regex_match(
                i->path().filename().string(), what, input_file_filter))
            continue;

        std::string file_name = i->path().string();
        std::vector<uint32_t> input_u32s;
        if (cmdargs.count("text")) {
            input_u32s = read_file_text(file_name);
        } else {
            input_u32s = read_file_u32(file_name);
        }
        std::string short_name = i->path().stem().string();

        run<ANSfold<1>>(input_u32s, short_name);
        run<ANSfold<2>>(input_u32s, short_name);
        run<ANSfold<3>>(input_u32s, short_name);
        run<ANSfold<4>>(input_u32s, short_name);
        run<ANSfold<5>>(input_u32s, short_name);
        run<ANSfold<6>>(input_u32s, short_name);
        run<ANSfold<7>>(input_u32s, short_name);
        run<ANSfold<8>>(input_u32s, short_name);

        run<ANSrfold<1>>(input_u32s, short_name);
        run<ANSrfold<2>>(input_u32s, short_name);
        run<ANSrfold<3>>(input_u32s, short_name);
        run<ANSrfold<4>>(input_u32s, short_name);
        run<ANSrfold<5>>(input_u32s, short_name);
        run<ANSrfold<6>>(input_u32s, short_name);
        run<ANSrfold<7>>(input_u32s, short_name);
        run<ANSrfold<8>>(input_u32s, short_name);
    }

    return EXIT_SUCCESS;
}